

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Dropout_x86_avx2::forward_inplace(Dropout_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [16];
  int iVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  Mat local_78;
  
  fVar3 = *(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx2[-3]);
  auVar20 = ZEXT464((uint)fVar3);
  if (fVar3 != 1.0) {
    iVar7 = bottom_top_blob->dims;
    if (bottom_top_blob->elempack == 4) {
      uVar8 = bottom_top_blob->w;
      uVar15 = bottom_top_blob->h;
      if (iVar7 == 3) {
        iVar16 = uVar15 * uVar8;
        iVar7 = bottom_top_blob->c;
        iVar14 = 0;
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        for (; iVar14 != iVar7; iVar14 = iVar14 + 1) {
          Mat::channel(&local_78,bottom_top_blob,iVar14);
          pauVar12 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          iVar9 = iVar16;
          while (bVar17 = iVar9 != 0, iVar9 = iVar9 + -1, bVar17) {
            auVar19._0_4_ = fVar3 * *(float *)*pauVar12;
            auVar19._4_4_ = fVar3 * *(float *)(*pauVar12 + 4);
            auVar19._8_4_ = fVar3 * *(float *)(*pauVar12 + 8);
            auVar19._12_4_ = fVar3 * *(float *)(*pauVar12 + 0xc);
            *(undefined1 (*) [16])*pauVar12 = auVar19;
            pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
          }
        }
      }
      else if (iVar7 == 2) {
        uVar11 = 0;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        uVar10 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar10 = 0;
        }
        for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          pauVar13 = (undefined1 (*) [16])
                     ((long)bottom_top_blob->w * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar15 = uVar8;
          while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
            auVar18._0_4_ = fVar3 * *(float *)*pauVar13;
            auVar18._4_4_ = fVar3 * *(float *)((long)*pauVar13 + 4);
            auVar18._8_4_ = fVar3 * *(float *)((long)*pauVar13 + 8);
            auVar18._12_4_ = fVar3 * *(float *)((long)*pauVar13 + 0xc);
            *pauVar13 = auVar18;
            pauVar13 = pauVar13 + 1;
          }
        }
      }
      else if (iVar7 == 1) {
        uVar10 = 0;
        uVar11 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar11 = uVar10;
        }
        for (; uVar11 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
          pfVar1 = (float *)((long)bottom_top_blob->data + uVar10);
          fVar4 = pfVar1[1];
          fVar5 = pfVar1[2];
          fVar6 = pfVar1[3];
          pfVar2 = (float *)((long)bottom_top_blob->data + uVar10);
          *pfVar2 = fVar3 * *pfVar1;
          pfVar2[1] = fVar3 * fVar4;
          pfVar2[2] = fVar3 * fVar5;
          pfVar2[3] = fVar3 * fVar6;
        }
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        iVar7 = Dropout::forward_inplace
                          ((Dropout *)
                           ((long)&this->_vptr_Dropout_x86_avx2 +
                           (long)this->_vptr_Dropout_x86_avx2[-3]),bottom_top_blob,opt);
        return iVar7;
      }
      uVar8 = bottom_top_blob->w;
      uVar15 = bottom_top_blob->h;
      if (iVar7 == 3) {
        iVar16 = uVar15 * uVar8;
        iVar7 = bottom_top_blob->c;
        iVar14 = 0;
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        for (; iVar14 != iVar7; iVar14 = iVar14 + 1) {
          auVar20 = ZEXT1664(auVar20._0_16_);
          Mat::channel(&local_78,bottom_top_blob,iVar14);
          pauVar12 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          iVar9 = iVar16;
          while (bVar17 = iVar9 != 0, iVar9 = iVar9 + -1, bVar17) {
            auVar23._0_4_ = fVar3 * *(float *)*pauVar12;
            auVar23._4_4_ = fVar3 * *(float *)(*pauVar12 + 4);
            auVar23._8_4_ = fVar3 * *(float *)(*pauVar12 + 8);
            auVar23._12_4_ = fVar3 * *(float *)(*pauVar12 + 0xc);
            auVar23._16_4_ = fVar3 * *(float *)(*pauVar12 + 0x10);
            auVar23._20_4_ = fVar3 * *(float *)(*pauVar12 + 0x14);
            auVar23._28_36_ = auVar20._28_36_;
            auVar23._24_4_ = fVar3 * *(float *)(*pauVar12 + 0x18);
            auVar20 = ZEXT3264(auVar23._0_32_);
            *pauVar12 = auVar23._0_32_;
            pauVar12 = pauVar12 + 1;
          }
        }
      }
      else if (iVar7 == 2) {
        uVar11 = 0;
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        uVar10 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar10 = 0;
        }
        for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          pauVar12 = (undefined1 (*) [32])
                     ((long)bottom_top_blob->w * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar15 = uVar8;
          while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
            auVar22._0_4_ = fVar3 * *(float *)*pauVar12;
            auVar22._4_4_ = fVar3 * *(float *)((long)*pauVar12 + 4);
            auVar22._8_4_ = fVar3 * *(float *)((long)*pauVar12 + 8);
            auVar22._12_4_ = fVar3 * *(float *)((long)*pauVar12 + 0xc);
            auVar22._16_4_ = fVar3 * *(float *)((long)*pauVar12 + 0x10);
            auVar22._20_4_ = fVar3 * *(float *)((long)*pauVar12 + 0x14);
            auVar22._28_36_ = auVar20._28_36_;
            auVar22._24_4_ = fVar3 * *(float *)((long)*pauVar12 + 0x18);
            auVar20 = ZEXT3264(auVar22._0_32_);
            *pauVar12 = auVar22._0_32_;
            pauVar12 = pauVar12 + 1;
          }
        }
      }
      else if (iVar7 == 1) {
        uVar10 = 0;
        uVar11 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar11 = uVar10;
        }
        for (; uVar11 * 0x20 != uVar10; uVar10 = uVar10 + 0x20) {
          pfVar1 = (float *)((long)bottom_top_blob->data + uVar10);
          auVar21._0_4_ = fVar3 * *pfVar1;
          auVar21._4_4_ = fVar3 * pfVar1[1];
          auVar21._8_4_ = fVar3 * pfVar1[2];
          auVar21._12_4_ = fVar3 * pfVar1[3];
          auVar21._16_4_ = fVar3 * pfVar1[4];
          auVar21._20_4_ = fVar3 * pfVar1[5];
          auVar21._28_36_ = auVar20._28_36_;
          auVar21._24_4_ = fVar3 * pfVar1[6];
          auVar20 = ZEXT3264(auVar21._0_32_);
          *(undefined1 (*) [32])((long)bottom_top_blob->data + uVar10) = auVar21._0_32_;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}